

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O1

void __thiscall Network::update_triangles(Network *this,uint node_i,uint node_j,bool added)

{
  pointer puVar1;
  _Rb_tree_color _Var2;
  pointer psVar3;
  _Base_ptr p_Var4;
  pointer puVar5;
  _Rb_tree_node_base *p_Var6;
  undefined7 in_register_00000009;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  uint uVar9;
  _Rb_tree_header *p_Var10;
  _Rb_tree_header *p_Var11;
  _Rb_tree_node_base *p_Var12;
  _Rb_tree_node_base *p_Var13;
  int iVar14;
  int iVar15;
  _Rb_tree_node_base *p_Var16;
  bool bVar17;
  vector<unsigned_int,_std::allocator<unsigned_int>_> intersection;
  
  uVar9 = (int)CONCAT71(in_register_00000009,added) - 1U | 1;
  psVar3 = (this->links).
           super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var16 = &psVar3[node_i]._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var6 = *(_Base_ptr *)((long)&psVar3[node_i]._M_t._M_impl.super__Rb_tree_header + 0x10);
  iVar15 = 0;
  iVar14 = 0;
  if (p_Var6 != p_Var16) {
    p_Var10 = &psVar3[node_j]._M_t._M_impl.super__Rb_tree_header;
    iVar14 = 0;
    do {
      _Var2 = p_Var6[1]._M_color;
      if (_Var2 != node_j) {
        p_Var4 = *(_Base_ptr *)((long)&psVar3[node_j]._M_t._M_impl.super__Rb_tree_header + 8);
        p_Var7 = &p_Var10->_M_header;
        for (; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
            p_Var4 = (&p_Var4->_M_left)[bVar17]) {
          bVar17 = (_Rb_tree_color)*(size_t *)(p_Var4 + 1) < _Var2;
          if (!bVar17) {
            p_Var7 = p_Var4;
          }
        }
        p_Var11 = p_Var10;
        if (((_Rb_tree_header *)p_Var7 != p_Var10) &&
           (p_Var11 = (_Rb_tree_header *)p_Var7,
           _Var2 < (_Rb_tree_color)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
          p_Var11 = p_Var10;
        }
        iVar14 = iVar14 + (uint)(p_Var11 != p_Var10);
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != p_Var16);
  }
  iVar14 = iVar14 * uVar9;
  puVar5 = (this->triangle_count).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar1 = puVar5 + node_i;
  *puVar1 = *puVar1 + iVar14;
  this->total_triangles = this->total_triangles + iVar14;
  p_Var13 = &psVar3[node_j]._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var6 = *(_Base_ptr *)((long)&psVar3[node_j]._M_t._M_impl.super__Rb_tree_header + 0x10);
  if (p_Var6 != p_Var13) {
    iVar15 = 0;
    do {
      _Var2 = p_Var6[1]._M_color;
      if (_Var2 != node_i) {
        p_Var8 = p_Var16;
        for (p_Var12 = *(_Base_ptr *)((long)&psVar3[node_i]._M_t._M_impl.super__Rb_tree_header + 8);
            p_Var12 != (_Rb_tree_node_base *)0x0; p_Var12 = (&p_Var12->_M_left)[bVar17]) {
          bVar17 = p_Var12[1]._M_color < _Var2;
          if (!bVar17) {
            p_Var8 = p_Var12;
          }
        }
        p_Var12 = p_Var16;
        if ((p_Var8 != p_Var16) && (p_Var12 = p_Var8, _Var2 < p_Var8[1]._M_color)) {
          p_Var12 = p_Var16;
        }
        iVar15 = iVar15 + (uint)(p_Var12 != p_Var16);
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != p_Var13);
  }
  iVar15 = iVar15 * uVar9;
  puVar5 = puVar5 + node_j;
  *puVar5 = *puVar5 + iVar15;
  this->total_triangles = this->total_triangles + iVar15;
  std::
  __set_intersection<std::_Rb_tree_const_iterator<unsigned_int>,std::_Rb_tree_const_iterator<unsigned_int>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (*(_Base_ptr *)((long)&psVar3[node_i]._M_t._M_impl.super__Rb_tree_header + 0x10),p_Var16
             ,*(_Base_ptr *)((long)&psVar3[node_j]._M_t._M_impl.super__Rb_tree_header + 0x10),
             p_Var13);
  this->total_triangles = this->total_triangles;
  return;
}

Assistant:

void update_triangles(unsigned int node_i, unsigned int node_j, bool added) {
        int sign = 2*added - 1;

        // update triangles in node_i
        unsigned int removed_triangles_i = 0;
        for (unsigned int node_k : links[node_i])
            if (node_k != node_j and links[node_j].count(node_k))
                removed_triangles_i++;
        triangle_count[node_i] += sign*removed_triangles_i;
        total_triangles += sign*removed_triangles_i;

        // update triangles in node_j
        unsigned int removed_triangles_j = 0;
        for (unsigned int node_k : links[node_j])
            if (node_k != node_i and links[node_i].count(node_k))
                removed_triangles_j++;
        triangle_count[node_j] += sign*removed_triangles_j;
        total_triangles += sign*removed_triangles_j;

        // update triangles in the other nodes.
        std::vector<unsigned int> intersection;
        std::set_intersection(links[node_i].begin(),
                              links[node_i].end(),
                              links[node_j].begin(),
                              links[node_j].end(),
                              std::back_inserter(intersection));

        for (unsigned int node_k : intersection)
            triangle_count[node_k] += sign*1;
        total_triangles += sign*intersection.size();
    }